

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O1

int4 __thiscall ParamEntry::justifiedContain(ParamEntry *this,Address *addr,int4 sz)

{
  undefined8 *puVar1;
  JoinRecord *pJVar2;
  pointer pVVar3;
  ulong uVar4;
  ulong uVar5;
  int4 iVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  Address entry;
  Address local_40;
  
  pJVar2 = this->joinrec;
  if (pJVar2 == (JoinRecord *)0x0) {
    uVar10 = (ulong)this->alignment;
    if (uVar10 == 0) {
      local_40.base = this->spaceid;
      local_40.offset = this->addressbase;
      iVar9 = Address::justifiedContain(&local_40,this->size,addr,sz,(bool)((byte)this->flags & 1));
    }
    else {
      iVar9 = -1;
      if (this->spaceid == addr->base) {
        uVar4 = addr->offset;
        uVar5 = this->addressbase;
        if (((uVar5 <= uVar4) && (uVar7 = ((long)sz - 1U) + uVar4, !CARRY8((long)sz - 1U,uVar4))) &&
           (uVar7 <= ((long)this->size + uVar5) - 1)) {
          if (((this->flags & 1) == 0) && ((this->spaceid->flags & 1) != 0)) {
            iVar8 = (int)(((uVar7 - uVar5) + 1) % uVar10);
            iVar9 = this->alignment - iVar8;
            if (iVar8 == 0) {
              iVar9 = 0;
            }
          }
          else {
            iVar9 = (int)((uVar4 - uVar5) % uVar10);
          }
        }
      }
    }
  }
  else {
    lVar12 = (long)((int)((ulong)((long)(pJVar2->pieces).
                                        super__Vector_base<VarnodeData,_std::allocator<VarnodeData>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pJVar2->pieces).
                                       super__Vector_base<VarnodeData,_std::allocator<VarnodeData>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                   -0x55555555);
    iVar8 = 0;
    lVar11 = lVar12 * 0x18 + -8;
    lVar12 = lVar12 + 1;
    do {
      if (lVar12 + -1 == 0 || lVar12 < 1) {
        return -1;
      }
      pVVar3 = (this->joinrec->pieces).super__Vector_base<VarnodeData,_std::allocator<VarnodeData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (undefined8 *)((long)pVVar3 + lVar11 + -0x10);
      local_40.base = (AddrSpace *)*puVar1;
      local_40.offset = puVar1[1];
      iVar6 = Address::justifiedContain
                        (&local_40,*(int4 *)((long)&pVVar3->space + lVar11),addr,sz,false);
      iVar9 = iVar6 + iVar8;
      iVar8 = (iVar6 >> 0x1f & *(uint *)((long)&pVVar3->space + lVar11)) + iVar8;
      lVar11 = lVar11 + -0x18;
      lVar12 = lVar12 + -1;
    } while (iVar6 < 0);
  }
  return iVar9;
}

Assistant:

int4 ParamEntry::justifiedContain(const Address &addr,int4 sz) const

{
  if (joinrec != (JoinRecord *)0) {
    int4 res = 0;
    for(int4 i=joinrec->numPieces()-1;i>=0;--i) { // Move from least significant to most
      const VarnodeData &vdata(joinrec->getPiece(i));
      int4 cur = vdata.getAddr().justifiedContain(vdata.size,addr,sz,false);
      if (cur<0)
	res += vdata.size;	// We skipped this many less significant bytes
      else {
	return res + cur;
      }
    }
    return -1;			// Not contained at all
  }
  if (alignment==0) {
    // Ordinary endian containment
    Address entry(spaceid,addressbase);
    return entry.justifiedContain(size,addr,sz,((flags&force_left_justify)!=0));
  }
  if (spaceid != addr.getSpace()) return -1;
  uintb startaddr = addr.getOffset();
  if (startaddr < addressbase) return -1;
  uintb endaddr = startaddr + sz - 1;
  if (endaddr < startaddr) return -1; // Don't allow wrap around
  if (endaddr > (addressbase+size-1)) return -1;
  startaddr -= addressbase;
  endaddr -= addressbase;
  if (!isLeftJustified()) {   // For right justified (big endian), endaddr must be aligned
    int4 res = (int4)((endaddr+1) % alignment);
    if (res==0) return 0;
    return (alignment-res);
  }
  return (int4)(startaddr % alignment);
}